

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_close(zip_t *zip)

{
  long lVar1;
  mz_bool mVar2;
  size_t sVar3;
  size_t sVar4;
  int local_54;
  mz_uint16 local_4e;
  int status;
  tdefl_status tStack_48;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 entrylen;
  tdefl_status done;
  mz_uint level;
  mz_zip_archive *pzip;
  zip_t *zip_local;
  
  _done = (zip_t *)0x0;
  local_54 = -1;
  pzip = &zip->archive;
  if (zip != (zip_t *)0x0) {
    _done = zip;
    if ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) {
      local_54 = 0;
    }
    else {
      _dos_time = zip->level & 0xf;
      if (_dos_time != 0) {
        tStack_48 = tdefl_compress_buffer(&(zip->entry).comp,"",0,TDEFL_FINISH);
        if ((tStack_48 != TDEFL_STATUS_DONE) && (tStack_48 != TDEFL_STATUS_OKAY)) goto LAB_0056aecd;
        pzip[1].m_pAlloc = *(mz_alloc_func *)&pzip[2].m_file_offset_alignment;
        pzip[1].m_pRealloc = *(mz_realloc_func *)&pzip[2].m_total_files;
        *(undefined2 *)&pzip[2].m_archive_size = 8;
      }
      sVar3 = strlen(*(char **)&pzip[1].m_total_files);
      status._2_2_ = (mz_uint16)sVar3;
      if ((pzip[1].m_pAlloc < (mz_alloc_func)0x100000000) &&
         (pzip[1].m_pRealloc < (mz_realloc_func)0x100000000)) {
        mz_zip_time_t_to_dos_time(pzip[0xd01].m_archive_size,(mz_uint16 *)&status,&local_4e);
        mVar2 = mz_zip_writer_create_local_dir_header
                          (&_done->archive,(mz_uint8 *)&pzip[1].m_pAlloc_opaque,status._2_2_,0,
                           *(mz_uint64 *)&pzip[1].m_file_offset_alignment,
                           (mz_uint64)pzip[1].m_pAlloc,*(mz_uint32 *)&pzip[1].m_pFree,
                           (mz_uint16)pzip[2].m_archive_size,0,(mz_uint16)status,local_4e);
        if ((mVar2 != 0) &&
           ((sVar4 = (*(_done->archive).m_pWrite)
                               ((_done->archive).m_pIO_opaque,(mz_uint64)pzip[1].m_pState,
                                &pzip[1].m_pAlloc_opaque,0x1e), sVar4 == 0x1e &&
            (mVar2 = mz_zip_writer_add_to_central_dir
                               (&_done->archive,*(char **)&pzip[1].m_total_files,status._2_2_,
                                (void *)0x0,0,"",0,*(mz_uint64 *)&pzip[1].m_file_offset_alignment,
                                (mz_uint64)pzip[1].m_pAlloc,*(mz_uint32 *)&pzip[1].m_pFree,
                                (mz_uint16)pzip[2].m_archive_size,0,(mz_uint16)status,local_4e,
                                (mz_uint64)pzip[1].m_pState,*(mz_uint32 *)&pzip[0xd00].m_pState),
            mVar2 != 0)))) {
          (_done->archive).m_total_files = (_done->archive).m_total_files + 1;
          (_done->archive).m_archive_size = (mz_uint64)pzip[1].m_pRealloc;
          local_54 = 0;
        }
      }
    }
  }
LAB_0056aecd:
  if ((pzip != (mz_zip_archive *)0x0) &&
     (pzip[0xd01].m_archive_size = 0, lVar1._0_4_ = pzip[1].m_total_files,
     lVar1._4_4_ = pzip[1].m_zip_mode, lVar1 != 0)) {
    free(*(void **)&pzip[1].m_total_files);
    pzip[1].m_total_files = 0;
    pzip[1].m_zip_mode = MZ_ZIP_MODE_INVALID;
  }
  return local_54;
}

Assistant:

int zip_entry_close(struct zip_t *zip) {
  mz_zip_archive *pzip = NULL;
  mz_uint level;
  tdefl_status done;
  mz_uint16 entrylen;
  mz_uint16 dos_time, dos_date;
  int status = -1;

  if (!zip) {
    // zip_t handler is not initialized
    goto cleanup;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    status = 0;
    goto cleanup;
  }

  level = zip->level & 0xF;
  if (level) {
    done = tdefl_compress_buffer(&(zip->entry.comp), "", 0, TDEFL_FINISH);
    if (done != TDEFL_STATUS_DONE && done != TDEFL_STATUS_OKAY) {
      // Cannot flush compressed buffer
      goto cleanup;
    }
    zip->entry.comp_size = zip->entry.state.m_comp_size;
    zip->entry.offset = zip->entry.state.m_cur_archive_file_ofs;
    zip->entry.method = MZ_DEFLATED;
  }

  entrylen = (mz_uint16)strlen(zip->entry.name);
  // no zip64 support yet
  if ((zip->entry.comp_size > 0xFFFFFFFF) || (zip->entry.offset > 0xFFFFFFFF)) {
    // No zip64 support, yet
    goto cleanup;
  }

  mz_zip_time_t_to_dos_time(zip->entry.m_time, &dos_time, &dos_date);
  if (!mz_zip_writer_create_local_dir_header(
          pzip, zip->entry.header, entrylen, 0, zip->entry.uncomp_size,
          zip->entry.comp_size, zip->entry.uncomp_crc32, zip->entry.method, 0,
          dos_time, dos_date)) {
    // Cannot create zip entry header
    goto cleanup;
  }

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.header_offset,
                     zip->entry.header,
                     sizeof(zip->entry.header)) != sizeof(zip->entry.header)) {
    // Cannot write zip entry header
    goto cleanup;
  }

  if (!mz_zip_writer_add_to_central_dir(
          pzip, zip->entry.name, entrylen, NULL, 0, "", 0,
          zip->entry.uncomp_size, zip->entry.comp_size, zip->entry.uncomp_crc32,
          zip->entry.method, 0, dos_time, dos_date, zip->entry.header_offset,
          zip->entry.external_attr)) {
    // Cannot write to zip central dir
    goto cleanup;
  }

  pzip->m_total_files++;
  pzip->m_archive_size = zip->entry.offset;
  status = 0;

cleanup:
  if (zip) {
    zip->entry.m_time = 0;
    CLEANUP(zip->entry.name);
  }
  return status;
}